

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

bool __thiscall cmCTestSVN::LoadRepositories(cmCTestSVN *this)

{
  size_t *psVar1;
  bool bVar2;
  iterator __tmp;
  _Node *p_Var3;
  vector<const_char_*,_std::allocator<const_char_*>_> svn_status;
  OutputLogger err;
  ExternalParser out;
  vector<const_char_*,_std::allocator<const_char_*>_> local_188;
  OutputLogger local_170;
  ExternalParser local_130;
  
  bVar2 = true;
  if ((this->Repositories).
      super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl._M_node.
      super__List_node_base._M_next == (_List_node_base *)&this->Repositories) {
    p_Var3 = std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::
             _M_create_node<>(&this->Repositories);
    std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
    psVar1 = &(this->Repositories).
              super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    this->RootInfo =
         (SVNInfo *)
         ((this->Repositories).
          super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
          _M_node.super__List_node_base._M_prev + 1);
    local_188.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_130.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x52db86;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_188,(char **)&local_130);
    ExternalParser::ExternalParser(&local_130,this,"external-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              (&local_170,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"external-err> ");
    bVar2 = RunSVNCommand(this,&local_188,(OutputParser *)&local_130,(OutputParser *)&local_170);
    local_170.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_0069c5a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.super_LineParser.Line._M_dataplus._M_p !=
        &local_170.super_LineParser.Line.field_2) {
      operator_delete(local_170.super_LineParser.Line._M_dataplus._M_p,
                      local_170.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    local_130.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__ExternalParser_0069a640;
    if (local_130.RegexExternal.program != (char *)0x0) {
      operator_delete__(local_130.RegexExternal.program);
    }
    local_130.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_0069c5a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.super_LineParser.Line._M_dataplus._M_p !=
        &local_130.super_LineParser.Line.field_2) {
      operator_delete(local_130.super_LineParser.Line._M_dataplus._M_p,
                      local_130.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    if (local_188.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_188.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_188.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return bVar2;
}

Assistant:

bool cmCTestSVN::LoadRepositories()
{
  if (!this->Repositories.empty()) {
    return true;
  }

  // Info for root repository
  this->Repositories.emplace_back();
  this->RootInfo = &(this->Repositories.back());

  // Run "svn status" to get the list of external repositories
  std::vector<const char*> svn_status;
  svn_status.push_back("status");
  ExternalParser out(this, "external-out> ");
  OutputLogger err(this->Log, "external-err> ");
  return this->RunSVNCommand(svn_status, &out, &err);
}